

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest16::iterate(FunctionalTest16 *this)

{
  GLuint GVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _shader_stage *p_Var4;
  GLuint GVar5;
  GLint GVar6;
  GLint GVar7;
  GLuint GVar8;
  GLuint GVar9;
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  undefined4 extraout_var;
  GLuint *pGVar14;
  TestError *this_00;
  NotSupportedError *this_01;
  int line;
  GLuint GVar15;
  ulong uVar16;
  char *pcVar17;
  uint n_stage;
  undefined4 uVar18;
  long lVar19;
  ulong uVar20;
  _shader_stage *p_Var21;
  bool stage_reset_status [5];
  _shader_stage cached_shader_stage_data;
  char local_13c [8];
  int local_134;
  _subroutine_uniform_value_verification local_130;
  uint local_12c;
  string local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  GLenum local_f8;
  _shader_stage *local_e8;
  _shader_stage *local_e0;
  _shader_stage *local_d8;
  _shader_stage *local_d0;
  _shader_stage *local_c8;
  ulong local_c0;
  _shader_stage *local_b8 [6];
  GLuint *local_88;
  GLuint *local_80;
  GLuint *local_78;
  GLuint *local_70;
  GLuint *local_68;
  _program *local_60;
  _shader_stage *local_58 [4];
  _program *local_38;
  long lVar13;
  
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar11);
  bVar10 = glu::ContextInfo::isExtensionSupported
                     (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar10) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"GL_ARB_shader_subroutine is not supported.","");
    tcu::NotSupportedError::NotSupportedError(this_01,&local_128);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar10 = glu::ContextInfo::isExtensionSupported
                     (((this->super_TestCase).m_context)->m_contextInfo,
                      "GL_ARB_separate_shader_objects");
  this->m_are_pipeline_objects_supported = bVar10;
  initTest(this);
  local_c8 = this->m_vs_po_descriptors;
  local_d0 = this->m_tc_po_descriptors;
  local_d8 = this->m_te_po_descriptors;
  local_e0 = this->m_gs_po_descriptors;
  local_e8 = this->m_fs_po_descriptors;
  local_60 = this->m_po_descriptors;
  local_68 = this->m_vs_po_ids;
  local_70 = this->m_te_po_ids;
  local_78 = this->m_tc_po_ids;
  local_80 = this->m_gs_po_ids;
  local_88 = this->m_fs_po_ids;
  uVar20 = 0;
  do {
    if ((int)uVar20 == 0) {
LAB_00979821:
      local_12c = 0;
      uVar16 = 0;
      local_c0 = uVar20;
      do {
        iVar11 = (int)uVar20;
        if (iVar11 == 0) {
          (**(code **)(lVar13 + 0x1680))(this->m_po_ids[uVar16]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          pcVar17 = "glUseProgram() call failed";
          line = 0x2114;
        }
        else {
          (**(code **)(lVar13 + 0x98))(this->m_pipeline_object_ids[uVar16]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          pcVar17 = "glBindProgramPipeline() call failed";
          line = 0x2119;
        }
        glu::checkError(dVar12,pcVar17,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,line);
        local_128._M_dataplus._M_p._0_4_ = iVar11;
        local_58[0] = (_shader_stage *)((ulong)local_58[0] & 0xffffffff00000000);
        verifySubroutineUniformValues
                  (this,(_test_case *)&local_128,&local_12c,
                   (_subroutine_uniform_value_verification *)local_58);
        if (iVar11 == 0) {
          local_58[0] = &local_60[uVar16].vertex;
          local_38 = local_60 + uVar16;
          local_58[1] = &local_60[uVar16].tess_control;
          local_58[2] = &local_60[uVar16].tess_evaluation;
          local_58[3] = &local_60[uVar16].geometry;
        }
        else {
          local_58[0] = local_c8 + uVar16;
          local_58[1] = local_d0 + uVar16;
          local_58[2] = local_d8 + uVar16;
          local_58[3] = local_e0 + uVar16;
          local_38 = (_program *)(local_e8 + uVar16);
        }
        lVar19 = 0;
        do {
          p_Var21 = local_58[lVar19];
          local_128._M_dataplus._M_p._4_4_ = p_Var21->function1_index;
          local_128._M_dataplus._M_p._0_4_ = local_128._M_dataplus._M_p._4_4_;
          if (p_Var21->default_subroutine1_value == local_128._M_dataplus._M_p._4_4_) {
            local_128._M_dataplus._M_p._0_4_ = p_Var21->function2_index;
          }
          if (p_Var21->default_subroutine2_value == local_128._M_dataplus._M_p._4_4_) {
            local_128._M_dataplus._M_p._4_4_ = p_Var21->function2_index;
          }
          GVar1 = p_Var21->function3_index;
          GVar15 = GVar1;
          if (p_Var21->default_subroutine3_value == GVar1) {
            GVar15 = p_Var21->function4_index;
          }
          if (p_Var21->default_subroutine4_value == GVar1) {
            GVar1 = p_Var21->function4_index;
          }
          local_128._M_string_length = CONCAT44(GVar1,GVar15);
          (**(code **)(lVar13 + 0x1668))(p_Var21->gl_stage,4,&local_128);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          glu::checkError(dVar12,"glUniformSubroutinesuiv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x213e);
          uVar20 = local_c0;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 5);
        uVar18 = (undefined4)local_c0;
        local_128._M_dataplus._M_p._0_4_ = uVar18;
        local_b8[0] = (_shader_stage *)CONCAT44(local_b8[0]._4_4_,1);
        verifySubroutineUniformValues
                  (this,(_test_case *)&local_128,&local_12c,
                   (_subroutine_uniform_value_verification *)local_b8);
        local_13c[4] = 0;
        local_13c[0] = '\0';
        local_13c[1] = '\0';
        local_13c[2] = '\0';
        local_13c[3] = '\0';
        switch(uVar20 & 0xffffffff) {
        case 0:
          (**(code **)(lVar13 + 0x1680))(this->m_po_ids[uVar16 & 0xffffffff ^ 1]);
          (**(code **)(lVar13 + 0x1680))(this->m_po_ids[uVar16]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          pcVar17 = "glUseProgram() call(s) failed.";
          iVar11 = 0x2153;
          goto LAB_00979c86;
        case 1:
          (**(code **)(lVar13 + 0x98))(this->m_pipeline_object_ids[uVar16 & 0xffffffff ^ 1]);
          (**(code **)(lVar13 + 0x98))(this->m_pipeline_object_ids[uVar16]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          pcVar17 = "glBindProgramPipeline() call(s) failed.";
          iVar11 = 0x2161;
LAB_00979c86:
          glu::checkError(dVar12,pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,iVar11);
          local_b8[0] = (_shader_stage *)CONCAT44(local_b8[0]._4_4_,uVar18);
          local_130 = SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES;
          verifySubroutineUniformValues(this,(_test_case *)local_b8,&local_12c,&local_130);
          goto LAB_00979e8d;
        case 2:
          uVar20 = uVar16 & 0xffffffff ^ 1;
          (**(code **)(lVar13 + 0x1688))
                    (this->m_pipeline_object_ids[uVar16],2,this->m_fs_po_ids[uVar20]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          glu::checkError(dVar12,"glUseProgramStages() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x216f);
          local_f8 = local_e8[uVar16].gl_stage;
          p_Var21 = local_e8 + uVar16;
          local_128._M_dataplus._M_p = *(pointer *)p_Var21;
          local_128._M_string_length._0_4_ = p_Var21->default_subroutine3_value;
          local_128._M_string_length._4_4_ = p_Var21->default_subroutine4_value;
          p_Var21 = local_e8 + uVar16;
          local_128.field_2._M_allocated_capacity._0_4_ = p_Var21->subroutine1_uniform_location;
          local_128.field_2._M_allocated_capacity._4_4_ = p_Var21->subroutine2_uniform_location;
          local_128.field_2._8_8_ = *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2);
          p_Var21 = local_e8 + uVar16;
          local_108._0_4_ = p_Var21->function1_index;
          local_108._4_4_ = p_Var21->function2_index;
          uStack_100 = *(undefined8 *)(&p_Var21->function1_index + 2);
          p_Var21 = local_e8 + uVar20;
          GVar15 = p_Var21->default_subroutine2_value;
          GVar1 = p_Var21->default_subroutine3_value;
          GVar5 = p_Var21->default_subroutine4_value;
          p_Var4 = local_e8 + uVar20;
          GVar6 = p_Var4->subroutine1_uniform_location;
          GVar7 = p_Var4->subroutine2_uniform_location;
          uVar2 = *(undefined8 *)(&p_Var4->subroutine1_uniform_location + 2);
          p_Var4 = local_e8 + uVar20;
          GVar8 = p_Var4->function1_index;
          GVar9 = p_Var4->function2_index;
          uVar3 = *(undefined8 *)(&p_Var4->function1_index + 2);
          p_Var4 = local_e8 + uVar16;
          p_Var4->default_subroutine1_value = p_Var21->default_subroutine1_value;
          p_Var4->default_subroutine2_value = GVar15;
          p_Var4->default_subroutine3_value = GVar1;
          p_Var4->default_subroutine4_value = GVar5;
          p_Var21 = local_e8 + uVar16;
          p_Var21->subroutine1_uniform_location = GVar6;
          p_Var21->subroutine2_uniform_location = GVar7;
          *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2) = uVar2;
          p_Var21 = local_e8 + uVar16;
          p_Var21->function1_index = GVar8;
          p_Var21->function2_index = GVar9;
          *(undefined8 *)(&p_Var21->function1_index + 2) = uVar3;
          local_e8[uVar16].gl_stage = local_e8[uVar20].gl_stage;
          local_13c[4] = 1;
          break;
        case 3:
          uVar20 = uVar16 & 0xffffffff ^ 1;
          (**(code **)(lVar13 + 0x1688))
                    (this->m_pipeline_object_ids[uVar16],4,this->m_gs_po_ids[uVar20]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          glu::checkError(dVar12,"glUseProgramStages() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2183);
          local_f8 = local_e0[uVar16].gl_stage;
          p_Var21 = local_e0 + uVar16;
          local_128._M_dataplus._M_p = *(pointer *)p_Var21;
          local_128._M_string_length._0_4_ = p_Var21->default_subroutine3_value;
          local_128._M_string_length._4_4_ = p_Var21->default_subroutine4_value;
          p_Var21 = local_e0 + uVar16;
          local_128.field_2._M_allocated_capacity._0_4_ = p_Var21->subroutine1_uniform_location;
          local_128.field_2._M_allocated_capacity._4_4_ = p_Var21->subroutine2_uniform_location;
          local_128.field_2._8_8_ = *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2);
          p_Var21 = local_e0 + uVar16;
          local_108._0_4_ = p_Var21->function1_index;
          local_108._4_4_ = p_Var21->function2_index;
          uStack_100 = *(undefined8 *)(&p_Var21->function1_index + 2);
          p_Var21 = local_e0 + uVar20;
          GVar15 = p_Var21->default_subroutine2_value;
          GVar1 = p_Var21->default_subroutine3_value;
          GVar5 = p_Var21->default_subroutine4_value;
          p_Var4 = local_e0 + uVar20;
          GVar6 = p_Var4->subroutine1_uniform_location;
          GVar7 = p_Var4->subroutine2_uniform_location;
          uVar2 = *(undefined8 *)(&p_Var4->subroutine1_uniform_location + 2);
          p_Var4 = local_e0 + uVar20;
          GVar8 = p_Var4->function1_index;
          GVar9 = p_Var4->function2_index;
          uVar3 = *(undefined8 *)(&p_Var4->function1_index + 2);
          p_Var4 = local_e0 + uVar16;
          p_Var4->default_subroutine1_value = p_Var21->default_subroutine1_value;
          p_Var4->default_subroutine2_value = GVar15;
          p_Var4->default_subroutine3_value = GVar1;
          p_Var4->default_subroutine4_value = GVar5;
          p_Var21 = local_e0 + uVar16;
          p_Var21->subroutine1_uniform_location = GVar6;
          p_Var21->subroutine2_uniform_location = GVar7;
          *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2) = uVar2;
          p_Var21 = local_e0 + uVar16;
          p_Var21->function1_index = GVar8;
          p_Var21->function2_index = GVar9;
          *(undefined8 *)(&p_Var21->function1_index + 2) = uVar3;
          local_e0[uVar16].gl_stage = local_e0[uVar20].gl_stage;
          local_13c[3] = 1;
          break;
        case 4:
          uVar20 = uVar16 & 0xffffffff ^ 1;
          (**(code **)(lVar13 + 0x1688))
                    (this->m_pipeline_object_ids[uVar16],8,this->m_tc_po_ids[uVar20]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          glu::checkError(dVar12,"glUseProgramStages() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2197);
          local_f8 = local_d0[uVar16].gl_stage;
          p_Var21 = local_d0 + uVar16;
          local_128._M_dataplus._M_p = *(pointer *)p_Var21;
          local_128._M_string_length._0_4_ = p_Var21->default_subroutine3_value;
          local_128._M_string_length._4_4_ = p_Var21->default_subroutine4_value;
          p_Var21 = local_d0 + uVar16;
          local_128.field_2._M_allocated_capacity._0_4_ = p_Var21->subroutine1_uniform_location;
          local_128.field_2._M_allocated_capacity._4_4_ = p_Var21->subroutine2_uniform_location;
          local_128.field_2._8_8_ = *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2);
          p_Var21 = local_d0 + uVar16;
          local_108._0_4_ = p_Var21->function1_index;
          local_108._4_4_ = p_Var21->function2_index;
          uStack_100 = *(undefined8 *)(&p_Var21->function1_index + 2);
          p_Var21 = local_d0 + uVar20;
          GVar15 = p_Var21->default_subroutine2_value;
          GVar1 = p_Var21->default_subroutine3_value;
          GVar5 = p_Var21->default_subroutine4_value;
          p_Var4 = local_d0 + uVar20;
          GVar6 = p_Var4->subroutine1_uniform_location;
          GVar7 = p_Var4->subroutine2_uniform_location;
          uVar2 = *(undefined8 *)(&p_Var4->subroutine1_uniform_location + 2);
          p_Var4 = local_d0 + uVar20;
          GVar8 = p_Var4->function1_index;
          GVar9 = p_Var4->function2_index;
          uVar3 = *(undefined8 *)(&p_Var4->function1_index + 2);
          p_Var4 = local_d0 + uVar16;
          p_Var4->default_subroutine1_value = p_Var21->default_subroutine1_value;
          p_Var4->default_subroutine2_value = GVar15;
          p_Var4->default_subroutine3_value = GVar1;
          p_Var4->default_subroutine4_value = GVar5;
          p_Var21 = local_d0 + uVar16;
          p_Var21->subroutine1_uniform_location = GVar6;
          p_Var21->subroutine2_uniform_location = GVar7;
          *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2) = uVar2;
          p_Var21 = local_d0 + uVar16;
          p_Var21->function1_index = GVar8;
          p_Var21->function2_index = GVar9;
          *(undefined8 *)(&p_Var21->function1_index + 2) = uVar3;
          local_d0[uVar16].gl_stage = local_d0[uVar20].gl_stage;
          local_13c[1] = 1;
          break;
        case 5:
          uVar20 = uVar16 & 0xffffffff ^ 1;
          (**(code **)(lVar13 + 0x1688))
                    (this->m_pipeline_object_ids[uVar16],0x10,this->m_te_po_ids[uVar20]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          glu::checkError(dVar12,"glUseProgramStages() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x21ab);
          local_f8 = local_d8[uVar16].gl_stage;
          p_Var21 = local_d8 + uVar16;
          local_128._M_dataplus._M_p = *(pointer *)p_Var21;
          local_128._M_string_length._0_4_ = p_Var21->default_subroutine3_value;
          local_128._M_string_length._4_4_ = p_Var21->default_subroutine4_value;
          p_Var21 = local_d8 + uVar16;
          local_128.field_2._M_allocated_capacity._0_4_ = p_Var21->subroutine1_uniform_location;
          local_128.field_2._M_allocated_capacity._4_4_ = p_Var21->subroutine2_uniform_location;
          local_128.field_2._8_8_ = *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2);
          p_Var21 = local_d8 + uVar16;
          local_108._0_4_ = p_Var21->function1_index;
          local_108._4_4_ = p_Var21->function2_index;
          uStack_100 = *(undefined8 *)(&p_Var21->function1_index + 2);
          p_Var21 = local_d8 + uVar20;
          GVar15 = p_Var21->default_subroutine2_value;
          GVar1 = p_Var21->default_subroutine3_value;
          GVar5 = p_Var21->default_subroutine4_value;
          p_Var4 = local_d8 + uVar20;
          GVar6 = p_Var4->subroutine1_uniform_location;
          GVar7 = p_Var4->subroutine2_uniform_location;
          uVar2 = *(undefined8 *)(&p_Var4->subroutine1_uniform_location + 2);
          p_Var4 = local_d8 + uVar20;
          GVar8 = p_Var4->function1_index;
          GVar9 = p_Var4->function2_index;
          uVar3 = *(undefined8 *)(&p_Var4->function1_index + 2);
          p_Var4 = local_d8 + uVar16;
          p_Var4->default_subroutine1_value = p_Var21->default_subroutine1_value;
          p_Var4->default_subroutine2_value = GVar15;
          p_Var4->default_subroutine3_value = GVar1;
          p_Var4->default_subroutine4_value = GVar5;
          p_Var21 = local_d8 + uVar16;
          p_Var21->subroutine1_uniform_location = GVar6;
          p_Var21->subroutine2_uniform_location = GVar7;
          *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2) = uVar2;
          p_Var21 = local_d8 + uVar16;
          p_Var21->function1_index = GVar8;
          p_Var21->function2_index = GVar9;
          *(undefined8 *)(&p_Var21->function1_index + 2) = uVar3;
          local_d8[uVar16].gl_stage = local_d8[uVar20].gl_stage;
          local_13c[2] = 1;
          break;
        case 6:
          uVar20 = uVar16 & 0xffffffff ^ 1;
          (**(code **)(lVar13 + 0x1688))
                    (this->m_pipeline_object_ids[uVar16],1,this->m_vs_po_ids[uVar20]);
          dVar12 = (**(code **)(lVar13 + 0x800))();
          glu::checkError(dVar12,"glUseProgramStages() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x21bf);
          local_f8 = local_c8[uVar16].gl_stage;
          p_Var21 = local_c8 + uVar16;
          local_128._M_dataplus._M_p = *(pointer *)p_Var21;
          local_128._M_string_length._0_4_ = p_Var21->default_subroutine3_value;
          local_128._M_string_length._4_4_ = p_Var21->default_subroutine4_value;
          p_Var21 = local_c8 + uVar16;
          local_128.field_2._M_allocated_capacity._0_4_ = p_Var21->subroutine1_uniform_location;
          local_128.field_2._M_allocated_capacity._4_4_ = p_Var21->subroutine2_uniform_location;
          local_128.field_2._8_8_ = *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2);
          p_Var21 = local_c8 + uVar16;
          local_108._0_4_ = p_Var21->function1_index;
          local_108._4_4_ = p_Var21->function2_index;
          uStack_100 = *(undefined8 *)(&p_Var21->function1_index + 2);
          p_Var21 = local_c8 + uVar20;
          GVar15 = p_Var21->default_subroutine2_value;
          GVar1 = p_Var21->default_subroutine3_value;
          GVar5 = p_Var21->default_subroutine4_value;
          p_Var4 = local_c8 + uVar20;
          GVar6 = p_Var4->subroutine1_uniform_location;
          GVar7 = p_Var4->subroutine2_uniform_location;
          uVar2 = *(undefined8 *)(&p_Var4->subroutine1_uniform_location + 2);
          p_Var4 = local_c8 + uVar20;
          GVar8 = p_Var4->function1_index;
          GVar9 = p_Var4->function2_index;
          uVar3 = *(undefined8 *)(&p_Var4->function1_index + 2);
          p_Var4 = local_c8 + uVar16;
          p_Var4->default_subroutine1_value = p_Var21->default_subroutine1_value;
          p_Var4->default_subroutine2_value = GVar15;
          p_Var4->default_subroutine3_value = GVar1;
          p_Var4->default_subroutine4_value = GVar5;
          p_Var21 = local_c8 + uVar16;
          p_Var21->subroutine1_uniform_location = GVar6;
          p_Var21->subroutine2_uniform_location = GVar7;
          *(undefined8 *)(&p_Var21->subroutine1_uniform_location + 2) = uVar2;
          p_Var21 = local_c8 + uVar16;
          p_Var21->function1_index = GVar8;
          p_Var21->function2_index = GVar9;
          *(undefined8 *)(&p_Var21->function1_index + 2) = uVar3;
          local_c8[uVar16].gl_stage = local_c8[uVar20].gl_stage;
          local_13c[0] = 1;
          break;
        default:
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognized test case",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                     ,0x21cc);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        local_b8[0] = local_c8 + uVar16;
        local_b8[1] = local_d0 + uVar16;
        local_b8[2] = local_d8 + uVar16;
        local_b8[3] = local_e0 + uVar16;
        local_b8[4] = local_e8 + uVar16;
        lVar19 = 0;
        do {
          local_130 = (_subroutine_uniform_value_verification)(local_13c[lVar19] != '\x01');
          verifySubroutineUniformValuesForShaderStage(this,local_b8[lVar19],&local_130);
          lVar19 = lVar19 + 1;
          uVar20 = local_c0;
        } while (lVar19 != 5);
LAB_00979e8d:
        switch((int)uVar20) {
        case 2:
          local_134 = 0x21f5;
          uVar20 = uVar20 & 0xffffffff;
          pGVar14 = local_88;
          p_Var21 = local_e8;
          break;
        case 3:
          local_134 = 0x2200;
          uVar20 = 4;
          pGVar14 = local_80;
          p_Var21 = local_e0;
          break;
        case 4:
          local_134 = 0x220b;
          uVar20 = 8;
          pGVar14 = local_78;
          p_Var21 = local_d0;
          break;
        case 5:
          local_134 = 0x2216;
          uVar20 = 0x10;
          pGVar14 = local_70;
          p_Var21 = local_d8;
          break;
        case 6:
          local_134 = 0x2220;
          uVar20 = 1;
          pGVar14 = local_68;
          p_Var21 = local_c8;
          break;
        default:
          goto switchD_00979ea8_default;
        }
        (**(code **)(lVar13 + 0x1688))(this->m_pipeline_object_ids[uVar16],uVar20,pGVar14[uVar16]);
        dVar12 = (**(code **)(lVar13 + 0x800))();
        glu::checkError(dVar12,"glUseProgramStages() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,local_134);
        p_Var21[uVar16].gl_stage = local_f8;
        p_Var4 = p_Var21 + uVar16;
        p_Var4->function1_index = (undefined4)local_108;
        p_Var4->function2_index = local_108._4_4_;
        *(undefined8 *)(&p_Var4->function1_index + 2) = uStack_100;
        p_Var4 = p_Var21 + uVar16;
        p_Var4->subroutine1_uniform_location = local_128.field_2._M_allocated_capacity._0_4_;
        p_Var4->subroutine2_uniform_location = local_128.field_2._M_allocated_capacity._4_4_;
        *(undefined8 *)(&p_Var4->subroutine1_uniform_location + 2) = local_128.field_2._8_8_;
        p_Var21 = p_Var21 + uVar16;
        p_Var21->default_subroutine1_value = (GLuint)local_128._M_dataplus._M_p;
        p_Var21->default_subroutine2_value = local_128._M_dataplus._M_p._4_4_;
        p_Var21->default_subroutine3_value = (GLuint)local_128._M_string_length;
        p_Var21->default_subroutine4_value = local_128._M_string_length._4_4_;
        uVar20 = local_c0;
switchD_00979ea8_default:
        uVar16 = uVar16 + 1;
        local_12c = (uint)uVar16;
      } while (uVar16 != 2);
      (**(code **)(lVar13 + 0x1680))(0);
      dVar12 = (**(code **)(lVar13 + 0x800))();
      glu::checkError(dVar12,"glUseProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x222f);
    }
    else {
      if ((int)uVar20 == 7) {
        bVar10 = this->m_has_test_passed == false;
        if (bVar10) {
          pcVar17 = "Fail";
        }
        else {
          pcVar17 = "Pass";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar10,
                   pcVar17);
        return STOP;
      }
      if (this->m_are_pipeline_objects_supported == true) goto LAB_00979821;
    }
    uVar20 = (ulong)((int)uVar20 + 1);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest16::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	m_are_pipeline_objects_supported =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_separate_shader_objects");

	/* Initialize GL objects required to run the test */
	initTest();

	/* Iterate over both pipelines/programs and verify that calling glUseProgram() /
	 * glBindProgramPipeline() / glUseProgramStages() resets subroutine uniform configuration.
	 */
	for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT); ++test_case)
	{
		if (static_cast<_test_case>(test_case) != TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT &&
			!m_are_pipeline_objects_supported)
		{
			/* Current test case requires GL_ARB_separate_shader_objects support which is
			 * unavaiable on the platform that we're testing
			 */
			continue;
		}

		for (unsigned int n_object_id = 0; n_object_id < 2; /* pipeline/program objects allocated for the test */
			 ++n_object_id)
		{
			/* Verify that currently reported subroutine uniform values are equal to default values */
			if (test_case == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT)
			{
				gl.useProgram(m_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");
			}
			else
			{
				gl.bindProgramPipeline(m_pipeline_object_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed");
			}

			verifySubroutineUniformValues(static_cast<_test_case>(test_case), n_object_id,
										  SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES);

			/* Re-configure subroutine uniforms so that they point to different subroutines than
			 * the default ones.
			 */
			const _shader_stage* stages[5 /* fs+gs+tc+te+vs */] = { DE_NULL };

			getShaderStages(static_cast<_test_case>(test_case) == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT,
							n_object_id, stages);

			for (unsigned int n_stage = 0; n_stage < 5 /* fs+gs+tc+te+vs stages */; ++n_stage)
			{
				const _shader_stage& current_stage				 = *(stages[n_stage]);
				glw::GLuint			 subroutine_configuration[4] = { GL_INVALID_INDEX };

				subroutine_configuration[0] =
					(current_stage.default_subroutine1_value == current_stage.function1_index) ?
						current_stage.function2_index :
						current_stage.function1_index;
				subroutine_configuration[1] =
					(current_stage.default_subroutine2_value == current_stage.function1_index) ?
						current_stage.function2_index :
						current_stage.function1_index;
				subroutine_configuration[2] =
					(current_stage.default_subroutine3_value == current_stage.function3_index) ?
						current_stage.function4_index :
						current_stage.function3_index;
				subroutine_configuration[3] =
					(current_stage.default_subroutine4_value == current_stage.function3_index) ?
						current_stage.function4_index :
						current_stage.function3_index;

				gl.uniformSubroutinesuiv(current_stage.gl_stage, 4 /* count */, subroutine_configuration);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() call failed.");
			} /* for (all stages) */

			verifySubroutineUniformValues(static_cast<_test_case>(test_case), n_object_id,
										  SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES);

			/* Execute test case-specific code */
			_shader_stage cached_shader_stage_data;
			bool		  stage_reset_status[Utils::SHADER_STAGE_COUNT] = { false, false, false, false, false };
			bool		  uses_stage_reset_status						= false;

			switch (test_case)
			{
			case TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT:
			{
				/* Switch to a different program object and then back to current PO.
				 * Subroutine uniforms should be back at their default settings, instead of
				 * the ones we've just set.
				 */
				gl.useProgram(m_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				gl.useProgram(m_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call(s) failed.");

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_PIPELINE_OBJECT:
			{
				/* Switch to a different pipeline object and then back to the current one.
				 * Subroutine uniforms should be back at their default settings, instead of
				 * the ones we've just set.
				 */
				gl.bindProgramPipeline(
					m_pipeline_object_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				gl.bindProgramPipeline(m_pipeline_object_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call(s) failed.");

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_FRAGMENT_STAGE:
			{
				/* Change the fragment shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_FRAGMENT_SHADER_BIT,
									m_fs_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_fs_po_descriptors[n_object_id];
				m_fs_po_descriptors[n_object_id] = m_fs_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_FRAGMENT] = true;
				uses_stage_reset_status							 = true;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_GEOMETRY_STAGE:
			{
				/* Change the geometry shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_GEOMETRY_SHADER_BIT,
									m_gs_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_gs_po_descriptors[n_object_id];
				m_gs_po_descriptors[n_object_id] = m_gs_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_GEOMETRY] = true;
				uses_stage_reset_status							 = true;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_CONTROL_STAGE:
			{
				/* Change the tessellation control shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_TESS_CONTROL_SHADER_BIT,
									m_tc_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_tc_po_descriptors[n_object_id];
				m_tc_po_descriptors[n_object_id] = m_tc_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_TESSELLATION_CONTROL] = true;
				uses_stage_reset_status										 = true;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_EVALUATION_STAGE:
			{
				/* Change the tessellation evaluation shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_TESS_EVALUATION_SHADER_BIT,
									m_te_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_te_po_descriptors[n_object_id];
				m_te_po_descriptors[n_object_id] = m_te_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_TESSELLATION_EVALUATION] = true;
				uses_stage_reset_status											= true;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_VERTEX_STAGE:
			{
				/* Change the vertex shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_VERTEX_SHADER_BIT,
									m_vs_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_vs_po_descriptors[n_object_id];
				m_vs_po_descriptors[n_object_id] = m_vs_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_VERTEX] = true;
				uses_stage_reset_status						   = true;

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized test case");
			}
			} /* switch (test_case) */

			/* Verify the subroutine uniform values are valid */
			if (!uses_stage_reset_status)
			{
				verifySubroutineUniformValues(static_cast<_test_case>(test_case), n_object_id,
											  SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES);
			}
			else
			{
				const _shader_stage* shader_stages[Utils::SHADER_STAGE_COUNT] = { DE_NULL };

				getShaderStages(static_cast<_test_case>(test_case) == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT,
								n_object_id, shader_stages);

				for (unsigned int n_shader_stage = 0; n_shader_stage < Utils::SHADER_STAGE_COUNT; ++n_shader_stage)
				{
					const _shader_stage& current_shader_stage = *(shader_stages[n_shader_stage]);

					if (stage_reset_status[n_shader_stage])
					{
						verifySubroutineUniformValuesForShaderStage(current_shader_stage,
																	SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES);
					}
					else
					{
						verifySubroutineUniformValuesForShaderStage(current_shader_stage,
																	SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES);
					}
				} /* for (all shader stages) */
			}

			/* Revert the changes some of the test cases appied */
			switch (test_case)
			{
			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_FRAGMENT_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_FRAGMENT_SHADER_BIT,
									m_fs_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_fs_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_GEOMETRY_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_GEOMETRY_SHADER_BIT,
									m_gs_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_gs_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_CONTROL_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_TESS_CONTROL_SHADER_BIT,
									m_tc_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_tc_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_EVALUATION_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_TESS_EVALUATION_SHADER_BIT,
									m_te_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_te_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_VERTEX_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_VERTEX_SHADER_BIT, m_vs_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_vs_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			default:
				break;
			} /* switch (test_case) */

		} /* for (all program object descriptors) */

		/* Unbind the program object */
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
	} /* for (all test cases) */

	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}